

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O3

void cinemo::threading::doSingleThreadedConversion
               (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw,
               Options *options)

{
  pointer ppLVar1;
  pointer pcVar2;
  char cVar3;
  ostream *poVar4;
  EVP_PKEY_CTX *ctx;
  pointer ppLVar5;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nSingle-threaded conversion is in progress...",0x2d);
  cVar3 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  ctx = (EVP_PKEY_CTX *)(ulong)(uint)(int)cVar3;
  std::ostream::put(-0x10);
  std::ostream::flush();
  ppLVar5 = (lw->super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar1 = (lw->super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar5 != ppLVar1) {
    do {
      LameWrapper::init(*ppLVar5,ctx);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MainThread",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," => ",4);
      pcVar2 = ((*ppLVar5)->file)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + ((*ppLVar5)->file)._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50,local_48);
      cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      ctx = (EVP_PKEY_CTX *)(ulong)(uint)(int)cVar3;
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (options->verbose == true) {
        LameWrapper::printWaveInfo(*ppLVar5);
      }
      LameWrapper::convertToMp3(*ppLVar5);
      ppLVar5 = ppLVar5 + 1;
    } while (ppLVar5 != ppLVar1);
  }
  return;
}

Assistant:

void doSingleThreadedConversion(const vector<LameWrapper*>& lw,
                                        const args::Options& options) {
            cout << "\nSingle-threaded conversion is in progress..." << endl;

            for (auto& work : lw) {
				work->init();
				cout << "MainThread" << " => " << work->getFileName()
					<< endl;
                if (options.verbose) {
                    work->printWaveInfo();
                }
                work->convertToMp3();
            }
        }